

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Parser::Parser(Parser *this)

{
  _Rb_tree_header *p_Var1;
  
  Tokenizer::Tokenizer(&this->m_tokenizer);
  this->m_element = ELEMENT_INCOMPLETE;
  (this->m_elementName)._M_dataplus._M_p = (pointer)&(this->m_elementName).field_2;
  (this->m_elementName)._M_string_length = 0;
  (this->m_elementName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_state = STATE_DATA;
  (this->m_attribName)._M_dataplus._M_p = (pointer)&(this->m_attribName).field_2;
  (this->m_attribName)._M_string_length = 0;
  (this->m_attribName).field_2._M_local_buf[0] = '\0';
  (this->m_entityValue)._M_dataplus._M_p = (pointer)&(this->m_entityValue).field_2;
  (this->m_entityValue)._M_string_length = 0;
  (this->m_entityValue).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Parser::Parser (void)
	: m_element		(ELEMENT_INCOMPLETE)
	, m_state		(STATE_DATA)
{
}